

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O3

void __thiscall
cfd::api::json::PsbtScriptData::ConvertFromStruct(PsbtScriptData *this,PsbtScriptDataStruct *data)

{
  std::__cxx11::string::_M_assign((string *)&this->asm__);
  std::__cxx11::string::_M_assign((string *)&this->hex_);
  std::__cxx11::string::_M_assign((string *)&this->type_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void PsbtScriptData::ConvertFromStruct(
    const PsbtScriptDataStruct& data) {
  asm__ = data.asm_;
  hex_ = data.hex;
  type_ = data.type;
  ignore_items = data.ignore_items;
}